

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  ImVector<unsigned_short> *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawListSplitter *pIVar10;
  ImDrawCmd *pIVar11;
  ImDrawChannel *pIVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  ImGuiContext *pIVar24;
  int n;
  uint uVar25;
  ulong uVar26;
  ImDrawChannel *pIVar27;
  long lVar28;
  int *piVar29;
  ulong uVar30;
  char *__function;
  int iVar31;
  float *pfVar32;
  ImDrawChannel *pIVar33;
  int iVar34;
  ImBitArray<132> *pIVar35;
  uint uVar36;
  ImGuiTableColumn *pIVar37;
  int iVar38;
  long lVar39;
  bool bVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  float local_168;
  ImBitArray<132> local_128;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8 [2];
  undefined8 local_d0;
  int iStack_c8;
  ImBitArray<132> local_c4 [7];
  
  pIVar24 = GImGui;
  pIVar10 = table->DrawSplitter;
  if (pIVar10->_Current != 0) {
    __assert_fail("splitter->_Current == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x918,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
  }
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  uVar36 = 0;
  memset(local_d8,0,0xa0);
  if (0 < table->ColumnsCount) {
    uVar30 = 0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar30 & 0x3f) & 1) != 0) {
        pIVar37 = (table->Columns).Data + uVar30;
        if ((table->Columns).DataEnd <= pIVar37) {
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                        ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]"
                       );
        }
        iVar38 = 0;
        do {
          bVar9 = *(byte *)((long)pIVar37 + (0x59 - (ulong)(iVar38 == 0)));
          if ((pIVar10->_Channels).Size <= (int)(uint)bVar9) goto LAB_00168e65;
          pIVar27 = (pIVar10->_Channels).Data;
          pIVar33 = pIVar27 + bVar9;
          iVar31 = pIVar27[bVar9]._CmdBuffer.Size;
          if ((0 < (long)iVar31) && ((pIVar33->_CmdBuffer).Data[(long)iVar31 + -1].ElemCount == 0))
          {
            (pIVar33->_CmdBuffer).Size = iVar31 + -1;
          }
          if ((pIVar33->_CmdBuffer).Size == 1) {
            if ((pIVar37->Flags & 0x100) == 0) {
              if (cVar7 < '\x01') {
                fVar42 = pIVar37->ContentMaxXUnfrozen;
LAB_00168891:
                uVar41 = -(uint)(pIVar37->ContentMaxXHeadersUsed <= fVar42);
                fVar42 = (float)(~uVar41 & (uint)pIVar37->ContentMaxXHeadersUsed |
                                (uint)fVar42 & uVar41);
              }
              else {
                if (iVar38 == 0) {
                  fVar42 = pIVar37->ContentMaxXFrozen;
                  goto LAB_00168891;
                }
                fVar42 = pIVar37->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar37->ClipRect).Max;
              if (pIVar1->x <= fVar42 && fVar42 != pIVar1->x) goto LAB_00168992;
            }
            if (cVar8 < '\x01') {
              uVar41 = 1;
            }
            else {
              uVar41 = (uint)((long)table->FreezeColumnsCount <= (long)uVar30);
            }
            uVar25 = (uint)(iVar38 != 0) * 2;
            if (cVar7 < '\x01') {
              uVar25 = 2;
            }
            if (0x83 < bVar9) {
              __assert_fail("channel_no < (4 + 64 * 2)",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                            ,0x949,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
            }
            uVar26 = (ulong)(uVar41 | uVar25);
            pfVar32 = local_d8 + uVar26 * 10;
            if ((&iStack_c8)[uVar26 * 10] == 0) {
              pfVar32[0] = 3.4028235e+38;
              pfVar32[1] = 3.4028235e+38;
              (&local_d0)[uVar26 * 5] = 0xff7fffffff7fffff;
            }
            ImBitArray<132>::SetBit(local_c4 + uVar26 * 2,(uint)bVar9);
            (&iStack_c8)[uVar26 * 10] = (&iStack_c8)[uVar26 * 10] + 1;
            if ((pIVar33->_CmdBuffer).Size < 1) {
              __function = "T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]";
              goto LAB_00168ecf;
            }
            pIVar11 = (pIVar33->_CmdBuffer).Data;
            fVar42 = (pIVar11->ClipRect).x;
            fVar4 = (pIVar11->ClipRect).y;
            fVar5 = (pIVar11->ClipRect).z;
            fVar6 = (pIVar11->ClipRect).w;
            if (fVar42 < *pfVar32) {
              *pfVar32 = fVar42;
            }
            if (fVar4 < local_d8[uVar26 * 10 + 1]) {
              local_d8[uVar26 * 10 + 1] = fVar4;
            }
            if (*(float *)(&local_d0 + uVar26 * 5) <= fVar5 &&
                fVar5 != *(float *)(&local_d0 + uVar26 * 5)) {
              *(float *)(&local_d0 + uVar26 * 5) = fVar5;
            }
            pfVar32 = (float *)((long)&local_d0 + uVar26 * 0x28 + 4);
            if (*pfVar32 <= fVar6 && fVar6 != *pfVar32) {
              *(float *)((long)&local_d0 + uVar26 * 0x28 + 4) = fVar6;
            }
            uVar36 = uVar36 | 1 << (uVar41 | uVar25);
          }
LAB_00168992:
          bVar40 = iVar38 == 0;
          iVar38 = iVar38 + -1;
        } while (('\0' < cVar7) && (bVar40));
        pIVar37->DrawChannelCurrent = 0xff;
      }
      uVar30 = uVar30 + 1;
    } while ((long)uVar30 < (long)table->ColumnsCount);
    if (uVar36 != 0) {
      iVar31 = pIVar10->_Count + -2;
      iVar38 = (pIVar24->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar38 < iVar31) {
        if (iVar38 == 0) {
          iVar34 = 8;
        }
        else {
          iVar34 = iVar38 / 2 + iVar38;
        }
        if (iVar34 <= iVar31) {
          iVar34 = iVar31;
        }
        if (iVar38 < iVar34) {
          pIVar27 = (ImDrawChannel *)MemAlloc((long)iVar34 << 5);
          pIVar33 = (pIVar24->DrawChannelsTempMergeBuffer).Data;
          if (pIVar33 != (ImDrawChannel *)0x0) {
            memcpy(pIVar27,pIVar33,(long)(pIVar24->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar24->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar24->DrawChannelsTempMergeBuffer).Data = pIVar27;
          (pIVar24->DrawChannelsTempMergeBuffer).Capacity = iVar34;
        }
      }
      (pIVar24->DrawChannelsTempMergeBuffer).Size = iVar31;
      pIVar33 = (pIVar24->DrawChannelsTempMergeBuffer).Data;
      local_128.Storage[0] = 0;
      local_128.Storage[1] = 0;
      local_128.Storage[2] = 0;
      local_128.Storage[3] = 0;
      local_128.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_128,2,pIVar10->_Count);
      ImBitArray<132>::ClearBit(&local_128,(uint)table->Bg2DrawChannelUnfrozen);
      if (cVar7 < '\x01') {
        iVar38 = -2;
      }
      else {
        iVar38 = -3;
        if (table->Bg2DrawChannelUnfrozen == '\x01') {
          __assert_fail("has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                        ,0x974,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
        }
      }
      iVar38 = iVar38 + pIVar10->_Count;
      fVar42 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      local_f8 = ZEXT416((uint)(table->HostClipRect).Max.x);
      local_108 = (table->HostClipRect).Max.y;
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_fc = 0;
      pIVar35 = local_c4;
      uVar30 = 0;
      do {
        iVar31 = (&iStack_c8)[uVar30 * 10];
        if (iVar31 != 0) {
          fVar5 = local_d8[uVar30 * 10];
          fVar6 = fVar5;
          if (fVar42 <= fVar5) {
            fVar6 = fVar42;
          }
          fVar44 = fVar6;
          if ('\0' < cVar8) {
            fVar44 = fVar5;
          }
          fVar5 = local_d8[uVar30 * 10 + 1];
          fVar43 = fVar5;
          if (fVar4 <= fVar5) {
            fVar43 = fVar4;
          }
          if (cVar7 < '\x01') {
            fVar5 = fVar43;
          }
          bVar40 = (uVar30 & 1) != 0;
          if (bVar40) {
            fVar6 = fVar44;
          }
          fVar44 = *(float *)(&local_d0 + uVar30 * 5);
          if (bVar40) {
            fVar44 = (float)(~-(uint)((float)local_f8._0_4_ <= fVar44) & local_f8._0_4_ |
                            -(uint)((float)local_f8._0_4_ <= fVar44) & (uint)fVar44);
          }
          if (uVar30 < 2) {
            fVar5 = fVar43;
          }
          local_168 = *(float *)((long)&local_d0 + uVar30 * 0x28 + 4);
          if ((uVar30 >= 2) && ((table->Flags & 0x20000) == 0)) {
            local_168 = (float)((uint)local_168 & -(uint)(local_108 <= local_168) |
                               ~-(uint)(local_108 <= local_168) & (uint)local_108);
          }
          lVar28 = 0;
          do {
            local_128.Storage[lVar28] = local_128.Storage[lVar28] & ~pIVar35->Storage[lVar28];
            lVar28 = lVar28 + 1;
          } while (lVar28 != 5);
          iVar38 = iVar38 - iVar31;
          if (0 < pIVar10->_Count) {
            fStack_dc = local_168;
            lVar28 = 0;
            lVar39 = 0;
            local_e8 = fVar6;
            fStack_e4 = fVar5;
            fStack_e0 = fVar44;
            do {
              bVar40 = ImBitArray<132>::TestBit(local_c4 + uVar30 * 2,(int)lVar39);
              if (bVar40) {
                ImBitArray<132>::ClearBit(local_c4 + uVar30 * 2,(int)lVar39);
                if ((pIVar10->_Channels).Size <= lVar39) goto LAB_00168e65;
                pIVar27 = (pIVar10->_Channels).Data;
                if ((((*(int *)((long)&(pIVar27->_CmdBuffer).Size + lVar28) != 1) ||
                     (pfVar32 = *(float **)((long)&(pIVar27->_CmdBuffer).Data + lVar28),
                     *pfVar32 < fVar6)) || (pfVar32[1] < fVar5)) ||
                   ((fVar44 < pfVar32[2] || (local_168 < pfVar32[3])))) {
                  __assert_fail("channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                                ,0x99f,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
                }
                iVar31 = iVar31 + -1;
                piVar29 = (int *)((long)&(pIVar27->_CmdBuffer).Size + lVar28);
                *(ulong *)pfVar32 = CONCAT44(fStack_e4,local_e8);
                *(ulong *)(pfVar32 + 2) = CONCAT44(fStack_dc,fStack_e0);
                iVar34 = *piVar29;
                iVar15 = piVar29[1];
                iVar16 = piVar29[2];
                iVar17 = piVar29[3];
                iVar18 = piVar29[5];
                iVar19 = piVar29[6];
                iVar20 = piVar29[7];
                (pIVar33->_IdxBuffer).Size = piVar29[4];
                (pIVar33->_IdxBuffer).Capacity = iVar18;
                *(int *)&(pIVar33->_IdxBuffer).Data = iVar19;
                *(int *)((long)&(pIVar33->_IdxBuffer).Data + 4) = iVar20;
                (pIVar33->_CmdBuffer).Size = iVar34;
                (pIVar33->_CmdBuffer).Capacity = iVar15;
                *(int *)&(pIVar33->_CmdBuffer).Data = iVar16;
                *(int *)((long)&(pIVar33->_CmdBuffer).Data + 4) = iVar17;
                pIVar33 = pIVar33 + 1;
              }
              lVar39 = lVar39 + 1;
            } while ((lVar39 < pIVar10->_Count) && (lVar28 = lVar28 + 0x20, iVar31 != 0));
          }
        }
        if (uVar30 == 1 && '\0' < cVar7) {
          bVar9 = table->Bg2DrawChannelUnfrozen;
          if ((pIVar10->_Channels).Size <= (int)(uint)bVar9) goto LAB_00168e65;
          pIVar12 = (pIVar10->_Channels).Data;
          pIVar27 = pIVar12 + bVar9;
          iVar31 = (pIVar27->_CmdBuffer).Size;
          iVar34 = (pIVar27->_CmdBuffer).Capacity;
          uVar13 = *(undefined4 *)&(pIVar27->_CmdBuffer).Data;
          uVar14 = *(undefined4 *)((long)&(pIVar27->_CmdBuffer).Data + 4);
          pIVar3 = &pIVar12[bVar9]._IdxBuffer;
          iVar15 = pIVar3->Capacity;
          uVar21 = *(undefined4 *)&pIVar3->Data;
          uVar22 = *(undefined4 *)((long)&pIVar3->Data + 4);
          (pIVar33->_IdxBuffer).Size = pIVar3->Size;
          (pIVar33->_IdxBuffer).Capacity = iVar15;
          *(undefined4 *)&(pIVar33->_IdxBuffer).Data = uVar21;
          *(undefined4 *)((long)&(pIVar33->_IdxBuffer).Data + 4) = uVar22;
          (pIVar33->_CmdBuffer).Size = iVar31;
          (pIVar33->_CmdBuffer).Capacity = iVar34;
          *(undefined4 *)&(pIVar33->_CmdBuffer).Data = uVar13;
          *(undefined4 *)((long)&(pIVar33->_CmdBuffer).Data + 4) = uVar14;
          pIVar33 = pIVar33 + 1;
        }
        uVar30 = uVar30 + 1;
        pIVar35 = pIVar35 + 2;
      } while (uVar30 != 4);
      iVar31 = pIVar10->_Count;
      if ((0 < iVar31) && (iVar38 != 0)) {
        lVar39 = 0;
        lVar28 = 0;
        do {
          bVar40 = ImBitArray<132>::TestBit(&local_128,(int)lVar28);
          if (bVar40) {
            if ((pIVar10->_Channels).Size <= lVar28) {
LAB_00168e65:
              __function = "T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]";
LAB_00168ecf:
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                            ,0x706,__function);
            }
            pIVar27 = (pIVar10->_Channels).Data;
            puVar2 = (undefined8 *)((long)&(pIVar27->_CmdBuffer).Size + lVar39);
            uVar23 = *puVar2;
            pIVar11 = (ImDrawCmd *)puVar2[1];
            piVar29 = (int *)((long)&(pIVar27->_IdxBuffer).Size + lVar39);
            iVar31 = piVar29[1];
            iVar34 = piVar29[2];
            iVar15 = piVar29[3];
            (pIVar33->_IdxBuffer).Size = *piVar29;
            (pIVar33->_IdxBuffer).Capacity = iVar31;
            *(int *)&(pIVar33->_IdxBuffer).Data = iVar34;
            *(int *)((long)&(pIVar33->_IdxBuffer).Data + 4) = iVar15;
            (pIVar33->_CmdBuffer).Size = (int)uVar23;
            (pIVar33->_CmdBuffer).Capacity = (int)((ulong)uVar23 >> 0x20);
            (pIVar33->_CmdBuffer).Data = pIVar11;
            pIVar33 = pIVar33 + 1;
            iVar38 = iVar38 + -1;
          }
          lVar28 = lVar28 + 1;
          iVar31 = pIVar10->_Count;
        } while ((lVar28 < iVar31) && (lVar39 = lVar39 + 0x20, iVar38 != 0));
      }
      pIVar27 = (pIVar24->DrawChannelsTempMergeBuffer).Data;
      if (pIVar33 != pIVar27 + (pIVar24->DrawChannelsTempMergeBuffer).Size) {
        __assert_fail("dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                      ,0x9b3,"void ImGui::TableMergeDrawChannels(ImGuiTable *)");
      }
      memcpy((pIVar10->_Channels).Data + 2,pIVar27,(long)iVar31 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}